

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O1

int __thiscall
PFData::fileReadSubgridAtGridIndexInternal
          (PFData *this,double *buffer,FILE *fp,int gridZ,int gridY,int gridX)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  
  lVar1 = getSubgridOffsetElements(this,gridZ,gridY,gridX);
  fseek((FILE *)fp,
        (long)(((this->m_q * gridZ + gridY) * this->m_p + gridX) * 0x24) + lVar1 * 8 + 100,0);
  iVar5 = this->m_p;
  iVar5 = ((uint)(gridX < this->m_nz % this->m_r) + this->m_nz / this->m_r) *
          ((uint)(gridY < this->m_ny % this->m_q) + this->m_ny / iVar5) *
          ((uint)(gridZ < this->m_nx % iVar5) + this->m_nx / iVar5);
  __n = (size_t)iVar5;
  sVar2 = fread(buffer,8,__n,(FILE *)fp);
  if (sVar2 == __n) {
    iVar6 = 0;
    if (iVar5 != 0) {
      iVar6 = 0;
      sVar2 = 0;
      do {
        dVar3 = (double)bswap64((uint64_t)buffer[sVar2]);
        buffer[sVar2] = dVar3;
        sVar2 = sVar2 + 1;
      } while (__n != sVar2);
    }
  }
  else {
    piVar4 = __errno_location();
    iVar6 = *piVar4;
  }
  return iVar6;
}

Assistant:

int PFData::fileReadSubgridAtGridIndexInternal(double* buffer, std::FILE* fp, int gridZ, int gridY, int gridX) const{
    const long long offset = getSubgridOffset(gridZ, gridY, gridX) + 36; //Skip header
    std::fseek(fp, offset, SEEK_SET);

    static_assert(sizeof(double) == 8, "Double must be 8 bytes");

    //Number of elements to read
    const long long count = getSubgridSizeX(gridZ) * getSubgridSizeY(gridY) * getSubgridSizeZ(gridX);

    std::size_t numRead = std::fread(buffer, 8, count, fp);
    if(numRead != static_cast<std::size_t>(count)){
        return errno;
    }

    //Perform endian conversion
    for(std::size_t i = 0; i < count; ++i){
        uint64_t tmp = *reinterpret_cast<uint64_t*>(&buffer[i]);
        tmp = bswap64(tmp);
        buffer[i] = *reinterpret_cast<double*>(&tmp);
    }

    return 0;
}